

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP4Deserializer::ParseMetadataIndex
          (BP4Deserializer *this,BufferSTL *bufferSTL,size_t absoluteStartPos,bool hasHeader,
          bool oneStepOnly)

{
  bool bVar1;
  _Alloc_hider _Var2;
  uchar uVar3;
  const_reference pvVar4;
  unsigned_long uVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  size_t *psVar6;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  byte in_R8B;
  uint64_t currentTimeStamp;
  uint64_t currentStepEndPos;
  uint64_t attributesIndexStart;
  uint64_t variablesIndexStart;
  uint64_t pgIndexStart;
  uint64_t mpiRank;
  uint64_t currentStep;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ptrs;
  char activeChar;
  uint8_t ascii;
  uint8_t endianness;
  size_t *position;
  vector<char,_std::allocator<char>_> *buffer;
  size_t *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  mapped_type *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffda0;
  allocator *paVar7;
  int commRank;
  string *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  string *source;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [38];
  uchar local_e2;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  undefined1 local_91 [56];
  undefined1 local_59 [40];
  uchar local_31;
  size_type *local_30;
  vector<char,_std::allocator<char>_> *local_28;
  byte local_1a;
  byte local_19;
  long local_18;
  
  commRank = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_28 = (vector<char,_std::allocator<char>_> *)(in_RSI + 0x40);
  local_30 = (size_type *)(in_RSI + 0x30);
  local_18 = in_RDX;
  if (local_19 != 0) {
    *local_30 = 0;
    source = (string *)&in_RDI->_M_string_length;
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](local_28,*local_30);
    std::__cxx11::string::assign((char *)source,(ulong)pvVar4);
    *local_30 = 0x24;
    local_31 = helper::ReadValue<unsigned_char>
                         ((vector<char,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                          in_stack_fffffffffffffd58,false);
    *(byte *)&in_RDI[2]._M_string_length = -(local_31 == '\0') & 1;
    bVar1 = helper::IsLittleEndian();
    if (bVar1 != (bool)((byte)in_RDI[2]._M_string_length & 1)) {
      in_stack_fffffffffffffdb0 = (string *)local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_59 + 1),"Toolkit",(allocator *)in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffda8 = (string *)local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_91 + 1),"format::bp::BP4Deserializer",
                 (allocator *)in_stack_fffffffffffffda8);
      paVar7 = &local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"ParseMetadataIndex",paVar7);
      commRank = (int)((ulong)paVar7 >> 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e0,
                 "reader found BigEndian bp file, this version of ADIOS2 wasn\'t compiled with the cmake flag -DADIOS2_USE_Endian_Reverse=ON explicitly, in call to Open"
                 ,&local_e1);
      helper::Throw<std::runtime_error>
                (in_RDI,source,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,commRank);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      std::__cxx11::string::~string((string *)(local_91 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_91);
      std::__cxx11::string::~string((string *)(local_59 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_59);
    }
    *(undefined1 *)((long)&in_RDI[2]._M_string_length + 1) = 1;
    *local_30 = 0x20;
    local_e2 = helper::ReadValue<unsigned_char>
                         ((vector<char,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                          in_stack_fffffffffffffd58,false);
    in_RDI[2].field_0x1 = local_e2 + 0xd0;
    *local_30 = 0x21;
    local_e2 = helper::ReadValue<unsigned_char>
                         ((vector<char,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                          in_stack_fffffffffffffd58,false);
    in_RDI[2].field_0x2 = local_e2 + 0xd0;
    *local_30 = 0x22;
    local_e2 = helper::ReadValue<unsigned_char>
                         ((vector<char,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                          in_stack_fffffffffffffd58,false);
    in_RDI[2].field_0x3 = local_e2 + 0xd0;
    *(uint *)&in_RDI[2].field_0x4 =
         (uint)(byte)in_RDI[2].field_0x1 * 1000000 + (uint)(byte)in_RDI[2].field_0x2 * 1000 +
         (uint)(byte)in_RDI[2].field_0x3;
    *local_30 = 0x25;
    _Var2 = (_Alloc_hider)
            helper::ReadValue<unsigned_char>
                      ((vector<char,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                       in_stack_fffffffffffffd58,false);
    in_RDI[2]._M_dataplus = _Var2;
    if (in_RDI[2]._M_dataplus != (_Alloc_hider)0x4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Toolkit",&local_109);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"format::bp::BP4Deserializer",&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"ParseMetadataIndex",&local_159);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffffd68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      std::operator+(in_stack_fffffffffffffd68,
                     (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      helper::Throw<std::runtime_error>
                (in_RDI,source,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,commRank);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    *local_30 = 0x26;
    uVar3 = helper::ReadValue<unsigned_char>
                      ((vector<char,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                       in_stack_fffffffffffffd58,false);
    in_RDI[2].field_2._M_local_buf[0] = -(uVar3 == '\x01') & 1;
    *local_30 = 0x40;
  }
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xc61add);
    helper::ReadValue<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd70,
               (size_t *)in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
    helper::ReadValue<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd70,
               (size_t *)in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
    uVar5 = helper::ReadValue<unsigned_long>
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd70,
                       (size_t *)in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(uVar5 - local_18);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd58);
    __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
          helper::ReadValue<unsigned_long>
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd70,
                     (size_t *)in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd58);
    helper::ReadValue<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd70,
               (size_t *)in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd58);
    helper::ReadValue<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd70,
               (size_t *)in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd58);
    helper::ReadValue<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd70,
               (size_t *)in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd70,
               (value_type *)in_stack_fffffffffffffd68);
    in_stack_fffffffffffffd70 =
         std::
         unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
         ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                      in_stack_fffffffffffffd58);
    in_stack_fffffffffffffd68 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
         ::operator[]((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                      in_stack_fffffffffffffd58);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_00,__x);
    *local_30 = *local_30 + 8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd70);
    in_stack_fffffffffffffd67 = false;
    if ((local_1a & 1) == 0) {
      in_stack_fffffffffffffd58 = (size_t *)*local_30;
      psVar6 = (size_t *)std::vector<char,_std::allocator<char>_>::size(local_28);
      in_stack_fffffffffffffd67 = in_stack_fffffffffffffd58 < psVar6;
    }
  } while ((bool)in_stack_fffffffffffffd67 != false);
  return;
}

Assistant:

void BP4Deserializer::ParseMetadataIndex(BufferSTL &bufferSTL, const size_t absoluteStartPos,
                                         const bool hasHeader, const bool oneStepOnly)
{
    const auto &buffer = bufferSTL.m_Buffer;
    size_t &position = bufferSTL.m_Position;

    if (hasHeader)
    {
        // Read header (64 bytes)
        // long version string
        position = m_VersionTagPosition;
        m_Minifooter.VersionTag.assign(&buffer[position], m_VersionTagLength);

        position = m_EndianFlagPosition;
        const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
        m_Minifooter.IsLittleEndian = (endianness == 0) ? true : false;
#ifndef ADIOS2_HAVE_ENDIAN_REVERSE
        if (helper::IsLittleEndian() != m_Minifooter.IsLittleEndian)
        {
            helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Deserializer",
                                              "ParseMetadataIndex",
                                              "reader found BigEndian bp file, "
                                              "this version of ADIOS2 wasn't compiled "
                                              "with the cmake flag -DADIOS2_USE_Endian_Reverse=ON "
                                              "explicitly, in call to Open");
        }
#endif

        // This has no flag in BP4 header. Always true
        m_Minifooter.HasSubFiles = true;

        // Writer's ADIOS version
        position = m_VersionMajorPosition;
        uint8_t ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionMajor = ascii - (uint8_t)'0';
        position = m_VersionMinorPosition;
        ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionMinor = ascii - (uint8_t)'0';
        position = m_VersionPatchPosition;
        ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionPatch = ascii - (uint8_t)'0';
        m_Minifooter.ADIOSVersion = m_Minifooter.ADIOSVersionMajor * 1000000 +
                                    m_Minifooter.ADIOSVersionMinor * 1000 +
                                    m_Minifooter.ADIOSVersionPatch;

        // BP version
        position = m_BPVersionPosition;
        m_Minifooter.Version =
            helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        if (m_Minifooter.Version != 4)
        {
            helper::Throw<std::runtime_error>(
                "Toolkit", "format::bp::BP4Deserializer", "ParseMetadataIndex",
                "ADIOS2 BP4 Engine only supports bp format "
                "version 4, found " +
                    std::to_string(m_Minifooter.Version) + " version");
        }

        // Writer active flag
        position = m_ActiveFlagPosition;
        const char activeChar =
            helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_WriterIsActive = (activeChar == '\1' ? true : false);

        // move position to first row
        position = 64;
    }

    // Read each record now
    do
    {
        std::vector<uint64_t> ptrs;
        const uint64_t currentStep =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        const uint64_t mpiRank =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        const uint64_t pgIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(pgIndexStart - absoluteStartPos);
        const uint64_t variablesIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(variablesIndexStart - absoluteStartPos);
        const uint64_t attributesIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(attributesIndexStart - absoluteStartPos);
        const uint64_t currentStepEndPos =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(currentStepEndPos - absoluteStartPos);
        const uint64_t currentTimeStamp =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(currentTimeStamp);
        m_MetadataIndexTable[mpiRank][currentStep] = ptrs;
        position += 8;
    } while (!oneStepOnly && position < buffer.size());
}